

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShuffledDeckGeneratorTests.cpp
# Opt level: O0

void __thiscall
solitaire::cards::ShuffledDeckGeneratorTest_generateShuffledDeck_Test::TestBody
          (ShuffledDeckGeneratorTest_generateShuffledDeck_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr__;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,_52UL>_>_>
  matcher;
  bool bVar1;
  iterator pvVar2;
  iterator pvVar3;
  char *pcVar4;
  long lVar5;
  array<solitaire::cards::Card,_52UL> *rhs;
  Card *pCVar6;
  Card *pCVar7;
  char *in_R9;
  byte bVar8;
  Card CStackY_908;
  undefined1 in_stack_fffffffffffff700 [408];
  Card in_stack_fffffffffffff898;
  AssertHelper local_708;
  Message local_700;
  testing local_6f8 [416];
  Card local_558 [52];
  char local_3b8 [416];
  undefined1 local_218 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1e8;
  Message local_1e0 [3];
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_;
  Deck generatedDeck;
  ShuffledDeckGeneratorTest_generateShuffledDeck_Test *this_local;
  
  bVar8 = 0;
  __return_storage_ptr__ = &gtest_ar_.message_;
  ShuffledDeckGenerator::generate
            ((Deck *)__return_storage_ptr__,&(this->super_ShuffledDeckGeneratorTest).generator);
  pvVar2 = std::array<solitaire::cards::Card,_52UL>::begin
                     ((array<solitaire::cards::Card,_52UL> *)__return_storage_ptr__);
  pvVar3 = std::array<solitaire::cards::Card,_52UL>::end
                     ((array<solitaire::cards::Card,_52UL> *)__return_storage_ptr__);
  local_1c1 = std::
              is_sorted<solitaire::cards::Card*,bool(*)(solitaire::cards::Card_const&,solitaire::cards::Card_const&)>
                        (pvVar2,pvVar3,anon_unknown_5::cardsComparator);
  local_1c1 = !local_1c1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_1c0,
               (AssertionResult *)
               "std::is_sorted( generatedDeck.begin(), generatedDeck.end(), cardsComparator )",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/cards/ShuffledDeckGeneratorTests.cpp"
               ,0x1e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1e8,local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  pvVar2 = std::array<solitaire::cards::Card,_52UL>::begin
                     ((array<solitaire::cards::Card,_52UL> *)&gtest_ar_.message_);
  pvVar3 = std::array<solitaire::cards::Card,_52UL>::end
                     ((array<solitaire::cards::Card,_52UL> *)&gtest_ar_.message_);
  std::
  sort<solitaire::cards::Card*,bool(*)(solitaire::cards::Card_const&,solitaire::cards::Card_const&)>
            (pvVar2,pvVar3,anon_unknown_5::cardsComparator);
  createSortedDeck();
  testing::ContainerEq<std::array<solitaire::cards::Card,52ul>>
            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,_52UL>_>_>
              *)local_558,local_6f8,rhs);
  pCVar6 = local_558;
  pCVar7 = &CStackY_908;
  for (lVar5 = 0x34; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pCVar7 = *pCVar6;
    pCVar6 = pCVar6 + (ulong)bVar8 * -2 + 1;
    pCVar7 = pCVar7 + (ulong)bVar8 * -2 + 1;
  }
  matcher.impl_.expected_._M_elems[0x33] = in_stack_fffffffffffff898;
  matcher.impl_.expected_._M_elems[0].value = (int)in_stack_fffffffffffff700._0_8_;
  matcher.impl_.expected_._M_elems[0].suit = (int)((ulong)in_stack_fffffffffffff700._0_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[1].value = (int)in_stack_fffffffffffff700._8_8_;
  matcher.impl_.expected_._M_elems[1].suit = (int)((ulong)in_stack_fffffffffffff700._8_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[2].value = (int)in_stack_fffffffffffff700._16_8_;
  matcher.impl_.expected_._M_elems[2].suit = (int)((ulong)in_stack_fffffffffffff700._16_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[3].value = (int)in_stack_fffffffffffff700._24_8_;
  matcher.impl_.expected_._M_elems[3].suit = (int)((ulong)in_stack_fffffffffffff700._24_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[4].value = (int)in_stack_fffffffffffff700._32_8_;
  matcher.impl_.expected_._M_elems[4].suit = (int)((ulong)in_stack_fffffffffffff700._32_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[5].value = (int)in_stack_fffffffffffff700._40_8_;
  matcher.impl_.expected_._M_elems[5].suit = (int)((ulong)in_stack_fffffffffffff700._40_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[6].value = (int)in_stack_fffffffffffff700._48_8_;
  matcher.impl_.expected_._M_elems[6].suit = (int)((ulong)in_stack_fffffffffffff700._48_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[7].value = (int)in_stack_fffffffffffff700._56_8_;
  matcher.impl_.expected_._M_elems[7].suit = (int)((ulong)in_stack_fffffffffffff700._56_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[8].value = (int)in_stack_fffffffffffff700._64_8_;
  matcher.impl_.expected_._M_elems[8].suit = (int)((ulong)in_stack_fffffffffffff700._64_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[9].value = (int)in_stack_fffffffffffff700._72_8_;
  matcher.impl_.expected_._M_elems[9].suit = (int)((ulong)in_stack_fffffffffffff700._72_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[10].value = (int)in_stack_fffffffffffff700._80_8_;
  matcher.impl_.expected_._M_elems[10].suit = (int)((ulong)in_stack_fffffffffffff700._80_8_ >> 0x20)
  ;
  matcher.impl_.expected_._M_elems[0xb].value = (int)in_stack_fffffffffffff700._88_8_;
  matcher.impl_.expected_._M_elems[0xb].suit =
       (int)((ulong)in_stack_fffffffffffff700._88_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0xc].value = (int)in_stack_fffffffffffff700._96_8_;
  matcher.impl_.expected_._M_elems[0xc].suit =
       (int)((ulong)in_stack_fffffffffffff700._96_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0xd].value = (int)in_stack_fffffffffffff700._104_8_;
  matcher.impl_.expected_._M_elems[0xd].suit =
       (int)((ulong)in_stack_fffffffffffff700._104_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0xe].value = (int)in_stack_fffffffffffff700._112_8_;
  matcher.impl_.expected_._M_elems[0xe].suit =
       (int)((ulong)in_stack_fffffffffffff700._112_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0xf].value = (int)in_stack_fffffffffffff700._120_8_;
  matcher.impl_.expected_._M_elems[0xf].suit =
       (int)((ulong)in_stack_fffffffffffff700._120_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x10].value = (int)in_stack_fffffffffffff700._128_8_;
  matcher.impl_.expected_._M_elems[0x10].suit =
       (int)((ulong)in_stack_fffffffffffff700._128_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x11].value = (int)in_stack_fffffffffffff700._136_8_;
  matcher.impl_.expected_._M_elems[0x11].suit =
       (int)((ulong)in_stack_fffffffffffff700._136_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x12].value = (int)in_stack_fffffffffffff700._144_8_;
  matcher.impl_.expected_._M_elems[0x12].suit =
       (int)((ulong)in_stack_fffffffffffff700._144_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x13].value = (int)in_stack_fffffffffffff700._152_8_;
  matcher.impl_.expected_._M_elems[0x13].suit =
       (int)((ulong)in_stack_fffffffffffff700._152_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x14].value = (int)in_stack_fffffffffffff700._160_8_;
  matcher.impl_.expected_._M_elems[0x14].suit =
       (int)((ulong)in_stack_fffffffffffff700._160_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x15].value = (int)in_stack_fffffffffffff700._168_8_;
  matcher.impl_.expected_._M_elems[0x15].suit =
       (int)((ulong)in_stack_fffffffffffff700._168_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x16].value = (int)in_stack_fffffffffffff700._176_8_;
  matcher.impl_.expected_._M_elems[0x16].suit =
       (int)((ulong)in_stack_fffffffffffff700._176_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x17].value = (int)in_stack_fffffffffffff700._184_8_;
  matcher.impl_.expected_._M_elems[0x17].suit =
       (int)((ulong)in_stack_fffffffffffff700._184_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x18].value = (int)in_stack_fffffffffffff700._192_8_;
  matcher.impl_.expected_._M_elems[0x18].suit =
       (int)((ulong)in_stack_fffffffffffff700._192_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x19].value = (int)in_stack_fffffffffffff700._200_8_;
  matcher.impl_.expected_._M_elems[0x19].suit =
       (int)((ulong)in_stack_fffffffffffff700._200_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x1a].value = (int)in_stack_fffffffffffff700._208_8_;
  matcher.impl_.expected_._M_elems[0x1a].suit =
       (int)((ulong)in_stack_fffffffffffff700._208_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x1b].value = (int)in_stack_fffffffffffff700._216_8_;
  matcher.impl_.expected_._M_elems[0x1b].suit =
       (int)((ulong)in_stack_fffffffffffff700._216_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x1c].value = (int)in_stack_fffffffffffff700._224_8_;
  matcher.impl_.expected_._M_elems[0x1c].suit =
       (int)((ulong)in_stack_fffffffffffff700._224_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x1d].value = (int)in_stack_fffffffffffff700._232_8_;
  matcher.impl_.expected_._M_elems[0x1d].suit =
       (int)((ulong)in_stack_fffffffffffff700._232_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x1e].value = (int)in_stack_fffffffffffff700._240_8_;
  matcher.impl_.expected_._M_elems[0x1e].suit =
       (int)((ulong)in_stack_fffffffffffff700._240_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x1f].value = (int)in_stack_fffffffffffff700._248_8_;
  matcher.impl_.expected_._M_elems[0x1f].suit =
       (int)((ulong)in_stack_fffffffffffff700._248_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x20].value = (int)in_stack_fffffffffffff700._256_8_;
  matcher.impl_.expected_._M_elems[0x20].suit =
       (int)((ulong)in_stack_fffffffffffff700._256_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x21].value = (int)in_stack_fffffffffffff700._264_8_;
  matcher.impl_.expected_._M_elems[0x21].suit =
       (int)((ulong)in_stack_fffffffffffff700._264_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x22].value = (int)in_stack_fffffffffffff700._272_8_;
  matcher.impl_.expected_._M_elems[0x22].suit =
       (int)((ulong)in_stack_fffffffffffff700._272_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x23].value = (int)in_stack_fffffffffffff700._280_8_;
  matcher.impl_.expected_._M_elems[0x23].suit =
       (int)((ulong)in_stack_fffffffffffff700._280_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x24].value = (int)in_stack_fffffffffffff700._288_8_;
  matcher.impl_.expected_._M_elems[0x24].suit =
       (int)((ulong)in_stack_fffffffffffff700._288_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x25].value = (int)in_stack_fffffffffffff700._296_8_;
  matcher.impl_.expected_._M_elems[0x25].suit =
       (int)((ulong)in_stack_fffffffffffff700._296_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x26].value = (int)in_stack_fffffffffffff700._304_8_;
  matcher.impl_.expected_._M_elems[0x26].suit =
       (int)((ulong)in_stack_fffffffffffff700._304_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x27].value = (int)in_stack_fffffffffffff700._312_8_;
  matcher.impl_.expected_._M_elems[0x27].suit =
       (int)((ulong)in_stack_fffffffffffff700._312_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x28].value = (int)in_stack_fffffffffffff700._320_8_;
  matcher.impl_.expected_._M_elems[0x28].suit =
       (int)((ulong)in_stack_fffffffffffff700._320_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x29].value = (int)in_stack_fffffffffffff700._328_8_;
  matcher.impl_.expected_._M_elems[0x29].suit =
       (int)((ulong)in_stack_fffffffffffff700._328_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x2a].value = (int)in_stack_fffffffffffff700._336_8_;
  matcher.impl_.expected_._M_elems[0x2a].suit =
       (int)((ulong)in_stack_fffffffffffff700._336_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x2b].value = (int)in_stack_fffffffffffff700._344_8_;
  matcher.impl_.expected_._M_elems[0x2b].suit =
       (int)((ulong)in_stack_fffffffffffff700._344_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x2c].value = (int)in_stack_fffffffffffff700._352_8_;
  matcher.impl_.expected_._M_elems[0x2c].suit =
       (int)((ulong)in_stack_fffffffffffff700._352_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x2d].value = (int)in_stack_fffffffffffff700._360_8_;
  matcher.impl_.expected_._M_elems[0x2d].suit =
       (int)((ulong)in_stack_fffffffffffff700._360_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x2e].value = (int)in_stack_fffffffffffff700._368_8_;
  matcher.impl_.expected_._M_elems[0x2e].suit =
       (int)((ulong)in_stack_fffffffffffff700._368_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x2f].value = (int)in_stack_fffffffffffff700._376_8_;
  matcher.impl_.expected_._M_elems[0x2f].suit =
       (int)((ulong)in_stack_fffffffffffff700._376_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x30].value = (int)in_stack_fffffffffffff700._384_8_;
  matcher.impl_.expected_._M_elems[0x30].suit =
       (int)((ulong)in_stack_fffffffffffff700._384_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x31].value = (int)in_stack_fffffffffffff700._392_8_;
  matcher.impl_.expected_._M_elems[0x31].suit =
       (int)((ulong)in_stack_fffffffffffff700._392_8_ >> 0x20);
  matcher.impl_.expected_._M_elems[0x32].value = (int)in_stack_fffffffffffff700._400_8_;
  matcher.impl_.expected_._M_elems[0x32].suit =
       (int)((ulong)in_stack_fffffffffffff700._400_8_ >> 0x20);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>>>>
  ::operator()((AssertionResult *)local_218,local_3b8,
               (array<solitaire::cards::Card,_52UL> *)"generatedDeck");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/cards/ShuffledDeckGeneratorTests.cpp"
               ,0x21,pcVar4);
    testing::internal::AssertHelper::operator=(&local_708,&local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  return;
}

Assistant:

TEST_F(ShuffledDeckGeneratorTest, generateShuffledDeck) {
    auto generatedDeck = generator.generate();

    EXPECT_FALSE(std::is_sorted(
        generatedDeck.begin(), generatedDeck.end(), cardsComparator
    ));

    std::sort(generatedDeck.begin(), generatedDeck.end(), cardsComparator);
    EXPECT_THAT(generatedDeck, ContainerEq(createSortedDeck()));
}